

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

A * hiberlite::Database::dbLoad<A>(bean_key *key)

{
  A *pAVar1;
  bean_key local_138;
  undefined1 local_120 [8];
  BeanLoader bl;
  bean_key *key_local;
  
  bl.actor.stmt.c.
  super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)key;
  BeanLoader::BeanLoader((BeanLoader *)local_120);
  bean_key::bean_key(&local_138,key);
  pAVar1 = BeanLoader::loadBean<A>((BeanLoader *)local_120,&local_138);
  bean_key::~bean_key(&local_138);
  BeanLoader::~BeanLoader((BeanLoader *)local_120);
  return pAVar1;
}

Assistant:

C* Database::dbLoad(bean_key key)
{
	BeanLoader bl;
	return bl.loadBean<C>(key);
}